

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-blob.cpp
# Opt level: O0

ShaderLibraryHandle __thiscall
nvrhi::createShaderLibraryPermutation
          (nvrhi *this,IDevice *device,void *blob,size_t blobSize,ShaderConstant *constants,
          uint32_t numConstants,bool errorIfNotFound)

{
  bool bVar1;
  long *plVar2;
  undefined8 uVar3;
  size_t *pSize;
  undefined1 local_68 [8];
  string message;
  size_t binarySize;
  void *binary;
  bool errorIfNotFound_local;
  ShaderConstant *pSStack_30;
  uint32_t numConstants_local;
  ShaderConstant *constants_local;
  size_t blobSize_local;
  void *blob_local;
  IDevice *device_local;
  
  binary._3_1_ = errorIfNotFound;
  binarySize = 0;
  message.field_2._8_8_ = 0;
  pSize = &message.field_2._M_allocated_capacity + 1;
  binary._4_4_ = numConstants;
  pSStack_30 = constants;
  constants_local = (ShaderConstant *)blobSize;
  blobSize_local = (size_t)blob;
  blob_local = device;
  device_local = (IDevice *)this;
  bVar1 = findPermutationInBlob(blob,blobSize,constants,numConstants,(void **)&binarySize,pSize);
  if (bVar1) {
    (**(code **)(*blob_local + 0xa8))(this,blob_local,binarySize,message.field_2._8_8_);
  }
  else {
    if ((binary._3_1_ & 1) != 0) {
      formatShaderNotFoundMessage_abi_cxx11_
                ((string *)local_68,(nvrhi *)blobSize_local,constants_local,(size_t)pSStack_30,
                 (ShaderConstant *)(ulong)binary._4_4_,(uint32_t)pSize);
      plVar2 = (long *)(**(code **)(*blob_local + 0x1b8))();
      uVar3 = std::__cxx11::string::c_str();
      (**(code **)(*plVar2 + 0x10))(plVar2,2,uVar3);
      std::__cxx11::string::~string((string *)local_68);
    }
    RefCountPtr<nvrhi::IShaderLibrary>::RefCountPtr
              ((RefCountPtr<nvrhi::IShaderLibrary> *)this,(nullptr_t)0x0);
  }
  return (ShaderLibraryHandle)(InterfaceType *)this;
}

Assistant:

ShaderLibraryHandle createShaderLibraryPermutation(IDevice* device, const void* blob, size_t blobSize,
        const ShaderConstant* constants, uint32_t numConstants, bool errorIfNotFound)
    {
        const void* binary = nullptr;
        size_t binarySize = 0;

        if (findPermutationInBlob(blob, blobSize, constants, numConstants, &binary, &binarySize))
        {
            return device->createShaderLibrary(binary, binarySize);
        }

        if (errorIfNotFound)
        {
            std::string message = formatShaderNotFoundMessage(blob, blobSize, constants, numConstants);
            device->getMessageCallback()->message(MessageSeverity::Error, message.c_str());
        }

        return nullptr;
    }